

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseDataArrayList
                 (char *in,char *end,ValueType type,DataArrayList **dataArrayList)

{
  DataArrayList *pDVar1;
  char *pcVar2;
  bool local_61;
  size_t local_60;
  size_t numValues;
  size_t numRefs;
  DataArrayList *currentDataList;
  DataArrayList *prev;
  Reference *refs;
  Value *currentValue;
  DataArrayList **dataArrayList_local;
  char *pcStack_20;
  ValueType type_local;
  char *end_local;
  char *in_local;
  
  in_local = in;
  if (((dataArrayList != (DataArrayList **)0x0) &&
      (*dataArrayList = (DataArrayList *)0x0, in != (char *)0x0)) && (in != end)) {
    currentValue = (Value *)dataArrayList;
    dataArrayList_local._4_4_ = type;
    pcStack_20 = end;
    end_local = in;
    end_local = lookForNextToken<char>(in,end);
    if (*end_local == *Grammar::OpenBracketToken) {
      end_local = end_local + 1;
      prev = (DataArrayList *)0x0;
      currentDataList = (DataArrayList *)0x0;
      numRefs = 0;
      do {
        numValues = 0;
        local_60 = 0;
        refs = (Reference *)0x0;
        end_local = parseDataList(end_local,pcStack_20,dataArrayList_local._4_4_,(Value **)&refs,
                                  &local_60,(Reference **)&prev,&numValues);
        if ((refs != (Reference *)0x0) || (numValues != 0)) {
          if (currentDataList == (DataArrayList *)0x0) {
            pDVar1 = createDataArrayList((Value *)refs,local_60,(Reference *)prev,numValues);
            *(DataArrayList **)currentValue = pDVar1;
            currentDataList = *(DataArrayList **)currentValue;
          }
          else {
            numRefs = (size_t)createDataArrayList((Value *)refs,local_60,(Reference *)prev,numValues
                                                 );
            if (currentDataList != (DataArrayList *)0x0) {
              currentDataList->m_next = (DataArrayList *)numRefs;
              currentDataList = (DataArrayList *)numRefs;
            }
          }
        }
        local_61 = *Grammar::CommaSeparator == *end_local && end_local != pcStack_20;
      } while (local_61);
      pcVar2 = lookForNextToken<char>(end_local,pcStack_20);
      end_local = pcVar2 + 1;
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseDataArrayList( char *in, char *end,Value::ValueType type, 
                                         DataArrayList **dataArrayList ) {
    if ( ddl_nullptr == dataArrayList ) {
        return in;
    }

    *dataArrayList = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == Grammar::OpenBracketToken[ 0 ] ) {
        ++in;
        Value *currentValue( ddl_nullptr );
        Reference *refs( ddl_nullptr );
        DataArrayList *prev( ddl_nullptr ), *currentDataList( ddl_nullptr );
        do {
            size_t numRefs( 0 ), numValues( 0 );
            currentValue = ddl_nullptr;

            in = parseDataList( in, end, type, &currentValue, numValues, &refs, numRefs );
            if( ddl_nullptr != currentValue || 0 != numRefs ) {
                if( ddl_nullptr == prev ) {
                    *dataArrayList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    prev = *dataArrayList;
                } else {
                    currentDataList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    if( ddl_nullptr != prev ) {
                        prev->m_next = currentDataList;
                        prev = currentDataList;
                    }
                }
            }
        } while( Grammar::CommaSeparator[ 0 ] == *in && in != end );
        in = lookForNextToken( in, end );
        ++in;
    }

    return in;
}